

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs_wrapper.hpp
# Opt level: O3

void __thiscall
AVSInterface::AVSInDelegator::Read
          (AVSInDelegator *this,char *name,vector<double,_std::allocator<double>_> *output)

{
  uint uVar1;
  iterator __position;
  char cVar2;
  int iVar3;
  AVSValue *pAVar4;
  code *pcVar5;
  long lVar6;
  long *plVar7;
  undefined8 *puVar8;
  int iVar9;
  AVSValue arg;
  double local_50;
  double local_48;
  AVSValue local_40;
  
  iVar3 = NameToIndex(this,name);
  if (AVS_linkage != (AVS_Linkage *)0x0) {
    pAVar4 = &this->_args;
    uVar1 = AVS_linkage->Size;
    if (0x508 < uVar1) {
      pcVar5 = (code *)AVS_linkage->AVSValue_OPERATOR_INDEX;
      plVar7 = (long *)((long)&pAVar4->type + *(long *)&AVS_linkage->field_0x510);
      if (((ulong)pcVar5 & 1) != 0) {
        pcVar5 = *(code **)(pcVar5 + *plVar7 + -1);
      }
      pAVar4 = (AVSValue *)(*pcVar5)(plVar7,iVar3);
      if (AVS_linkage == (AVS_Linkage *)0x0) goto LAB_0010f89a;
      uVar1 = AVS_linkage->Size;
    }
    if (0x4d8 < uVar1) {
      pcVar5 = (code *)AVS_linkage->AVSValue_CONSTRUCTOR9;
      plVar7 = (long *)((long)&local_40.type + *(long *)&AVS_linkage->field_0x4e0);
      if (((ulong)pcVar5 & 1) != 0) {
        pcVar5 = *(code **)(pcVar5 + *plVar7 + -1);
      }
      (*pcVar5)(plVar7,pAVar4);
      if (AVS_linkage == (AVS_Linkage *)0x0) goto LAB_0010f89a;
    }
    if (0x578 < (uint)AVS_linkage->Size) {
      pcVar5 = (code *)AVS_linkage->IsArray;
      if (((ulong)pcVar5 & 1) != 0) {
        pcVar5 = *(code **)(pcVar5 + *(long *)((long)&local_40.type +
                                              *(long *)&AVS_linkage->field_0x580) + -1);
      }
      cVar2 = (*pcVar5)();
      if (cVar2 != '\0') {
        iVar3 = 0;
        if ((AVS_linkage != (AVS_Linkage *)0x0) && (0x628 < (uint)AVS_linkage->Size)) {
          pcVar5 = (code *)AVS_linkage->ArraySize;
          if (((ulong)pcVar5 & 1) != 0) {
            pcVar5 = *(code **)(pcVar5 + *(long *)((long)&local_40.type +
                                                  *(long *)&AVS_linkage->field_0x630) + -1);
          }
          iVar3 = (*pcVar5)();
        }
        if (*(long *)(output + 8) != *(long *)output) {
          *(long *)(output + 8) = *(long *)output;
        }
        if (0 < iVar3) {
          iVar9 = 0;
          do {
            local_50 = 0.0;
            if ((AVS_linkage != (AVS_Linkage *)0x0) && (0x508 < (uint)AVS_linkage->Size)) {
              pcVar5 = (code *)AVS_linkage->AVSValue_OPERATOR_INDEX;
              plVar7 = (long *)((long)&local_40.type + *(long *)&AVS_linkage->field_0x510);
              if (((ulong)pcVar5 & 1) != 0) {
                pcVar5 = *(code **)(pcVar5 + *plVar7 + -1);
              }
              lVar6 = (*pcVar5)(plVar7,iVar9);
              if ((AVS_linkage != (AVS_Linkage *)0x0) && (0x5c8 < (uint)AVS_linkage->Size)) {
                pcVar5 = (code *)AVS_linkage->AsFloat1;
                plVar7 = (long *)(lVar6 + *(long *)&AVS_linkage->field_0x5d0);
                if (((ulong)pcVar5 & 1) != 0) {
                  pcVar5 = *(code **)(pcVar5 + *plVar7 + -1);
                }
                local_50 = (double)(*pcVar5)(plVar7);
              }
            }
            local_48 = local_50;
            __position._M_current = *(double **)(output + 8);
            if (__position._M_current == *(double **)(output + 0x10)) {
              std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                        (output,__position,&local_48);
            }
            else {
              *__position._M_current = local_50;
              *(double **)(output + 8) = __position._M_current + 1;
            }
            iVar9 = iVar9 + 1;
          } while (iVar3 != iVar9);
        }
        AVSValue::~AVSValue(&local_40);
        return;
      }
    }
  }
LAB_0010f89a:
  puVar8 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar8 = "Argument is not array";
  __cxa_throw(puVar8,&char_const*::typeinfo,0);
}

Assistant:

void Read(const char* name, std::vector<double>& output) override {
      auto arg = _args[NameToIndex(name)];
      if (!arg.IsArray())
        throw "Argument is not array";
      auto size = arg.ArraySize();
      output.clear();
      for (int i = 0; i < size; i++)
        output.push_back(arg[i].AsFloat());
    }